

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_conservative_state
          (Impl *this,Value *state,VkPipelineRasterizationConservativeStateCreateInfoEXT **out_info)

{
  double dVar1;
  VkPipelineRasterizationConservativeStateCreateInfoEXT *pVVar2;
  Type pGVar3;
  
  pVVar2 = (VkPipelineRasterizationConservativeStateCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkPipelineRasterizationConservativeStateCreateInfoEXT *)0x0) {
    pVVar2->flags = 0;
    pVVar2->conservativeRasterizationMode = VK_CONSERVATIVE_RASTERIZATION_MODE_DISABLED_EXT;
    *(undefined8 *)&pVVar2->extraPrimitiveOverestimationSize = 0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar2->flags = (pGVar3->data_).s.length;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"conservativeRasterizationMode");
    if ((undefined1  [16])((undefined1  [16])pGVar3->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2->conservativeRasterizationMode = (pGVar3->data_).s.length;
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"extraPrimitiveOverestimationSize");
      dVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(pGVar3);
      pVVar2->extraPrimitiveOverestimationSize = (float)dVar1;
      *out_info = pVVar2;
      return true;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_conservative_state(const Value &state,
                                                                 VkPipelineRasterizationConservativeStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationConservativeStateCreateInfoEXT>();

	info->flags = state["flags"].GetUint();
	info->conservativeRasterizationMode = static_cast<VkConservativeRasterizationModeEXT>(state["conservativeRasterizationMode"].GetUint());
	info->extraPrimitiveOverestimationSize = state["extraPrimitiveOverestimationSize"].GetFloat();

	*out_info = info;
	return true;
}